

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O3

int __thiscall duckdb::Sign(duckdb *this,hugeint_t n)

{
  uint64_t uVar1;
  hugeint_t local_40;
  hugeint_t local_30;
  
  uVar1 = n.lower;
  hugeint_t::hugeint_t(&local_30,0);
  hugeint_t::hugeint_t(&local_40,0);
  return (uint)(local_30.lower < this && local_30.upper == uVar1 || local_30.upper < (long)uVar1) -
         (uint)(this < local_40.lower && local_40.upper == uVar1 ||
               local_40.upper != uVar1 && (long)uVar1 <= local_40.upper);
}

Assistant:

int Sign(hugeint_t n) {
	return ((n > 0) - (n < 0));
}